

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::writeQueuedControlMessage(WebSocketImpl *this)

{
  byte opcode;
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  undefined8 *puVar3;
  Coroutine<void> *this_00;
  ControlMessage *pCVar4;
  Array<unsigned_char> *other;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *other_00;
  PromiseFulfiller<void> *pPVar5;
  size_t payloadLen;
  AsyncIoStream *pAVar6;
  Promise<void> *promise;
  long *plVar7;
  long *plVar8;
  Array<unsigned_char> *this_01;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_02;
  Mask *this_03;
  ArrayPtr<const_unsigned_char> *native;
  PromiseAwaiter<void> *__return_storage_ptr__;
  Promise<void> *awaitable;
  undefined8 in_RSI;
  void *pvVar9;
  void *in_stack_fffffffffffff8f0;
  int local_6e0;
  int local_6d4;
  ArrayPtr<const_unsigned_char> *local_640;
  int local_618;
  undefined1 local_511;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_510;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller_1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_fulfiller3691;
  ArrayPtr<const_unsigned_char> local_330;
  byte local_31c [4];
  ArrayPtr<const_unsigned_char> local_318;
  ArrayPtr<unsigned_char> local_2e8;
  undefined1 local_2c9;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_2c8;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_fulfiller3676;
  WebSocketImpl *this_local;
  
  this_local = this;
  puVar3 = (undefined8 *)operator_new(0x4a0);
  *puVar3 = writeQueuedControlMessage;
  puVar3[1] = writeQueuedControlMessage;
  plVar7 = puVar3 + 0x8d;
  plVar8 = puVar3 + 0x8e;
  this_01 = (Array<unsigned_char> *)(puVar3 + 0x85);
  this_02 = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(puVar3 + 0x88);
  this_03 = (Mask *)((long)puVar3 + 0x494);
  native = (ArrayPtr<const_unsigned_char> *)(puVar3 + 0x7e);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar3 + 0x47);
  awaitable = (Promise<void> *)(puVar3 + 0x90);
  this_00 = (Coroutine<void> *)(puVar3 + 2);
  puVar3[0x91] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0x82),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"writeQueuedControlMessage",0xe54,0x15);
  pvVar9 = (void *)puVar3[0x84];
  kj::_::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar3 + 0x82));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x499));
  if (!bVar2) {
    *(undefined1 *)(puVar3 + 0x93) = 0;
    _GLOBAL__N_1::WebSocketImpl::writeQueuedControlMessage(in_stack_fffffffffffff8f0,pvVar9);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x499));
  pCVar4 = kj::_::readMaybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>
                     ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *)
                      (puVar3[0x91] + 0x310));
  *plVar7 = (long)pCVar4;
  if (*plVar7 == 0) {
LAB_00733cd0:
    local_6e0 = 0;
  }
  else {
    lVar1 = puVar3[0x91];
    *plVar8 = *plVar7;
    *(byte *)((long)puVar3 + 0x49a) = *(byte *)*plVar8;
    other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)(*plVar8 + 8));
    Array<unsigned_char>::Array(this_01,other);
    other_00 = mv<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
                         ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                          (*plVar8 + 0x20));
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(this_02,other_00);
    Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::operator=
              ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *)(lVar1 + 0x310));
    if (((*(byte *)(puVar3[0x91] + 0x160) & 1) == 0) && ((*(byte *)(puVar3[0x91] + 0x161) & 1) == 0)
       ) {
      Maybe<kj::EntropySource_&>::Maybe
                ((Maybe<kj::EntropySource_&> *)(puVar3 + 0x8f),
                 (PropagateConst<kj::EntropySource,_Maybe<EntropySource_&>_> *)(puVar3[0x91] + 0x20)
                );
      Mask::Mask(this_03,(Maybe<kj::EntropySource_&> *)(puVar3 + 0x8f));
      bVar2 = Mask::isZero(this_03);
      if (!bVar2) {
        local_2e8 = kj::Array::operator_cast_to_ArrayPtr((Array *)this_01);
        Mask::apply(this_03,local_2e8);
      }
      local_640 = native;
      do {
        ArrayPtr<const_unsigned_char>::ArrayPtr(local_640);
        local_640 = local_640 + 1;
      } while (local_640 != (ArrayPtr<const_unsigned_char> *)(puVar3 + 0x82));
      lVar1 = puVar3[0x91];
      opcode = *(byte *)((long)puVar3 + 0x49a);
      payloadLen = Array<unsigned_char>::size(this_01);
      local_31c = *&this_03->maskBytes;
      local_318 = Header::compose((Header *)(lVar1 + 0x163),true,false,opcode,payloadLen,
                                  (Mask)local_31c);
      *native = local_318;
      local_330 = kj::Array::operator_cast_to_ArrayPtr((Array *)this_01);
      *(ArrayPtr<const_unsigned_char> *)(puVar3 + 0x80) = local_330;
      pAVar6 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                         ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(puVar3[0x91] + 0x10));
      ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>::ArrayPtr<2ul>
                ((ArrayPtr<kj::ArrayPtr<unsigned_char_const>const> *)(puVar3 + 0x8a),
                 (ArrayPtr<const_unsigned_char> (*) [2])native);
      (*(pAVar6->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
                (awaitable,&pAVar6->super_AsyncOutputStream,puVar3[0x8a],puVar3[0x8b]);
      promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,awaitable);
      co_await<void>(__return_storage_ptr__,promise);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar2) {
        *(undefined1 *)(puVar3 + 0x93) = 1;
        _GLOBAL__N_1::WebSocketImpl::writeQueuedControlMessage(in_stack_fffffffffffff8f0,pvVar9);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<void>::~Promise(awaitable);
      fulfiller_1 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(this_02);
      if (fulfiller_1 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
        local_510 = fulfiller_1;
        pPVar5 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(fulfiller_1);
        (*(pPVar5->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar5,&local_511);
      }
      local_618 = 0;
    }
    else {
      fulfiller = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(this_02);
      if (fulfiller != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
        local_2c8 = fulfiller;
        pPVar5 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(fulfiller);
        (*(pPVar5->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar5,&local_2c9);
      }
      kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
      local_618 = 3;
    }
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(this_02);
    Array<unsigned_char>::~Array(this_01);
    if (local_618 == 0) {
      local_6d4 = 0;
    }
    else {
      local_6d4 = local_618;
    }
    if (local_6d4 == 0) goto LAB_00733cd0;
    local_6e0 = local_6d4;
  }
  if (local_6e0 == 0) {
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
  }
  else if (local_6e0 != 3) goto LAB_00733e84;
  kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x49b));
  if (!bVar2) {
    *puVar3 = 0;
    *(undefined1 *)(puVar3 + 0x93) = 2;
    _GLOBAL__N_1::WebSocketImpl::writeQueuedControlMessage(in_stack_fffffffffffff8f0,pvVar9);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x49b));
LAB_00733e84:
  kj::_::Coroutine<void>::~Coroutine(this_00);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x4a0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> writeQueuedControlMessage() {
    KJ_IF_SOME(q, queuedControlMessage) {
      byte opcode = q.opcode;
      kj::Array<byte> payload = kj::mv(q.payload);
      auto maybeFulfiller = kj::mv(q.fulfiller);
      queuedControlMessage = kj::none;

      if (hasSentClose || disconnected) {
        KJ_IF_SOME(fulfiller, maybeFulfiller) {
          fulfiller->fulfill();
        }
        co_return;
      }

      Mask mask(maskKeyGenerator);
      if (!mask.isZero()) {
        mask.apply(payload);
      }

      kj::ArrayPtr<const byte> sendParts[2];
      sendParts[0] = sendHeader.compose(true, false, opcode, payload.size(), mask);
      sendParts[1] = payload;
      co_await stream->write(sendParts);
      KJ_IF_SOME(fulfiller, maybeFulfiller) {
        fulfiller->fulfill();
      }
    }
  }